

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::MultiThreadedObjectTest::MultiThreadedObjectTest
          (MultiThreadedObjectTest *this,EglTestContext *context,char *name,char *description,
          deUint32 type)

{
  MultiThreadedTest::MultiThreadedTest
            (&this->super_MultiThreadedTest,context,name,description,2,20000000);
  (this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultiThreadedObjectTest_003ec270;
  this->m_config = (EGLConfig)0x0;
  deRandom_init(&(this->m_rnd0).m_rnd,0x37820a7);
  deRandom_init(&(this->m_rnd1).m_rnd,0x38647);
  this->m_types = type;
  this->m_hasWindow = 0;
  memset(&this->m_sharedNativePixmaps,0,0x120);
  return;
}

Assistant:

MultiThreadedObjectTest::MultiThreadedObjectTest (EglTestContext& context, const char* name, const char* description, deUint32 type)
	: MultiThreadedTest (context, name, description, 2, 20000000/*us = 20s*/) // \todo [mika] Set timeout to something relevant to frameworks timeout?
	, m_config			(DE_NULL)
	, m_rnd0			(58204327)
	, m_rnd1			(230983)
	, m_types			((Type)type)
	, m_hasWindow		(0)
{
}